

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS.h
# Opt level: O1

__type * __thiscall
NS::
wrap<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
          (__type *__return_storage_ptr__,NS *this,char *first,char *rest,char *rest_1,char *rest_2,
          char *rest_3,char *rest_4,char *rest_5,char *rest_6,char *rest_7,char *rest_8,char *rest_9
          ,char *rest_10,char *rest_11,char *rest_12,char *rest_13,char *rest_14,char *rest_15,
          char *rest_16,char *rest_17,char *rest_18,char *rest_19,char *rest_20,char *rest_21,
          char *rest_22,char *rest_23)

{
  _Head_base<23UL,_N_*,_false> this_00;
  undefined1 local_f8 [200];
  
  this_00._M_head_impl = (N *)N::operator_new(0x78,this);
  N::N<char_const*>(this_00._M_head_impl,first);
  local_f8._0_8_ = this_00._M_head_impl;
  wrap<char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*,char_const*>
            ((__type *)(local_f8 + 8),this,rest,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,
             rest_8,rest_9,rest_10,rest_11,rest_12,rest_13,rest_14,rest_15,rest_16,rest_17,rest_18,
             rest_19,rest_20,rest_21,rest_22,rest_23);
  std::
  __tuple_concater<std::tuple<N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>,std::_Index_tuple<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul>,std::tuple<N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>>
  ::_S_do<N*>(__return_storage_ptr__,
              (__tuple_concater<std::tuple<N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>,std::_Index_tuple<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul>,std::tuple<N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*,N*>>
               *)(local_f8 + 8),
              (tuple<N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*,_N_*>
               *)local_f8,(N **)rest_1);
  return __return_storage_ptr__;
}

Assistant:

auto wrap(DataType first, Args  ... rest) {
        return std::tuple_cat(wrap(first), wrap(rest...));
    }